

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O3

int libssh2_knownhost_del(LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost *entry)

{
  known_host *entry_00;
  int iVar1;
  
  if ((entry != (libssh2_knownhost *)0x0) && (entry->magic == 0xdeadcafe)) {
    entry_00 = (known_host *)entry->node;
    _libssh2_list_remove((list_node *)entry_00);
    entry->name = (char *)0x0;
    entry->key = (char *)0x0;
    *(undefined8 *)entry = 0;
    entry->node = (void *)0x0;
    *(undefined8 *)&entry->typemask = 0;
    free_host(hosts->session,entry_00);
    return 0;
  }
  iVar1 = _libssh2_error(hosts->session,-0x22,"Invalid host information");
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_del(LIBSSH2_KNOWNHOSTS *hosts,
                      struct libssh2_knownhost *entry)
{
    struct known_host *node;

    /* check that this was retrieved the right way or get out */
    if(!entry || (entry->magic != KNOWNHOST_MAGIC))
        return _libssh2_error(hosts->session, LIBSSH2_ERROR_INVAL,
                              "Invalid host information");

    /* get the internal node pointer */
    node = entry->node;

    /* unlink from the list of all hosts */
    _libssh2_list_remove(&node->node);

    /* clear the struct now since the memory in which it is allocated is
       about to be freed! */
    memset(entry, 0, sizeof(struct libssh2_knownhost));

    /* free all resources */
    free_host(hosts->session, node);

    return 0;
}